

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2vectors.c
# Opt level: O2

void test_v2vectors(void)

{
  uint8_t *puVar1;
  char *__s;
  uint __line;
  size_t __n;
  char cVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  undefined8 *puVar5;
  size_t sVar6;
  size_t sVar7;
  void *__s2;
  undefined8 *puVar8;
  size_t footer_len;
  undefined8 *local_470;
  uint8_t *footer;
  size_t dec_len;
  uint8_t nonce [24];
  uint8_t key [32];
  
  __stream = fopen("test/v2vectors.csv","r");
  if (__stream == (FILE *)0x0) {
    perror("Failed to load v2vectors.csv");
    abort();
  }
  puVar5 = (undefined8 *)0x0;
  puVar8 = (undefined8 *)0x0;
  while( true ) {
    pcVar4 = fgets((char *)key,0x400,__stream);
    if (pcVar4 == (char *)0x0) break;
    if (key[0] != '#') {
      local_470 = puVar5;
      puVar5 = (undefined8 *)calloc(1,0x38);
      pcVar4 = strdup((char *)key);
      puVar5[1] = pcVar4;
      pcVar4 = strchr(pcVar4,0x3b);
      *pcVar4 = '\0';
      puVar5[2] = pcVar4 + 1;
      pcVar4 = strchr(pcVar4 + 1,0x3b);
      *pcVar4 = '\0';
      puVar5[3] = pcVar4 + 1;
      pcVar4 = strchr(pcVar4 + 1,0x3b);
      *pcVar4 = '\0';
      puVar5[4] = pcVar4 + 1;
      pcVar4 = strchr(pcVar4 + 1,0x3b);
      *pcVar4 = '\0';
      puVar5[5] = pcVar4 + 1;
      pcVar4 = strchr(pcVar4 + 1,0x3b);
      *pcVar4 = '\0';
      puVar5[6] = pcVar4 + 1;
      pcVar4 = strchr(pcVar4 + 1,10);
      *pcVar4 = '\0';
      if (*(char *)puVar5[6] == '\0') {
        puVar5[6] = 0;
      }
      if (puVar8 == (undefined8 *)0x0) {
        puVar8 = puVar5;
      }
      if (local_470 != (undefined8 *)0x0) {
        *local_470 = puVar5;
      }
    }
  }
  while( true ) {
    if (puVar8 == (undefined8 *)0x0) {
      return;
    }
    printf("Running test \'%s\'...",puVar8[1]);
    nonce_load_hex(nonce,(char *)puVar8[6]);
    puVar1 = (uint8_t *)puVar8[3];
    sVar6 = strlen((char *)puVar1);
    generate_reference_nonce(nonce,puVar1,sVar6);
    nonce_override(nonce);
    cVar2 = paseto_v2_local_load_key_hex(key,puVar8[4]);
    if (cVar2 == '\0') break;
    pcVar4 = (char *)puVar8[3];
    sVar6 = strlen(pcVar4);
    __s = (char *)puVar8[5];
    sVar7 = strlen(__s);
    pcVar4 = (char *)paseto_v2_local_encrypt(pcVar4,sVar6,key,__s,sVar7);
    if (pcVar4 == (char *)0x0) {
      perror("paseto_v2_local_encrypt failed");
      pcVar4 = "enc != NULL";
      __line = 0x55;
      goto LAB_00101f50;
    }
    iVar3 = strcmp((char *)puVar8[2],pcVar4);
    if (iVar3 != 0) {
      pcVar4 = "strcmp(case_->encrypted, enc) == 0";
      __line = 0x56;
      goto LAB_00101f50;
    }
    free(pcVar4);
    printf(" encryption ok...");
    __s2 = (void *)paseto_v2_local_decrypt(puVar8[2],&dec_len,key,&footer,&footer_len);
    __n = dec_len;
    if (__s2 == (void *)0x0) {
      perror("paseto_v2_local_decrypt failed");
      pcVar4 = "dec != NULL";
      __line = 0x62;
      goto LAB_00101f50;
    }
    pcVar4 = (char *)puVar8[3];
    sVar6 = strlen(pcVar4);
    if (__n != sVar6) {
      pcVar4 = "dec_len == strlen(case_->message)";
      __line = 99;
      goto LAB_00101f50;
    }
    iVar3 = bcmp(pcVar4,__s2,__n);
    if (iVar3 != 0) {
      pcVar4 = "memcmp(case_->message, dec, dec_len) == 0";
      __line = 100;
      goto LAB_00101f50;
    }
    paseto_free(__s2);
    pcVar4 = (char *)puVar8[5];
    sVar6 = strlen(pcVar4);
    puVar1 = footer;
    if (sVar6 == 0) {
      if (footer != (uint8_t *)0x0) {
        pcVar4 = "footer == NULL";
        __line = 0x67;
        goto LAB_00101f50;
      }
      if (footer_len != 0) {
        pcVar4 = "footer_len == 0";
        __line = 0x68;
        goto LAB_00101f50;
      }
    }
    else {
      if (footer == (uint8_t *)0x0) {
        pcVar4 = "footer != NULL";
        __line = 0x6a;
        goto LAB_00101f50;
      }
      if (footer_len != sVar6) {
        pcVar4 = "footer_len == strlen(case_->footer)";
        __line = 0x6b;
        goto LAB_00101f50;
      }
      iVar3 = strcmp(pcVar4,(char *)footer);
      if (iVar3 != 0) {
        pcVar4 = "strcmp(case_->footer, (const char *) footer) == 0";
        __line = 0x6c;
        goto LAB_00101f50;
      }
      paseto_free(puVar1);
    }
    puts(" decryption ok");
    puVar8 = (undefined8 *)*puVar8;
  }
  pcVar4 = "paseto_v2_local_load_key_hex(key, case_->key) == true";
  __line = 0x4f;
LAB_00101f50:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/v2vectors.c"
                ,__line,"void test_v2vectors(void)");
}

Assistant:

void test_v2vectors(void) {
    struct test_case *cases = load_csv();
    for (struct test_case *case_ = cases; case_; case_ = case_->next) {
        printf("Running test '%s'...", case_->name);
        uint8_t nonce[paseto_v2_LOCAL_NONCEBYTES];
        nonce_load_hex(nonce, case_->nonce);
        generate_reference_nonce(nonce,
                (const uint8_t *) case_->message,
                strlen(case_->message));
        nonce_override(nonce);
        uint8_t key[paseto_v2_LOCAL_KEYBYTES];
        assert(paseto_v2_local_load_key_hex(key, case_->key) == true);
        char *enc = paseto_v2_local_encrypt(
                (const uint8_t *) case_->message, strlen(case_->message),
                key,
                (const uint8_t *) case_->footer, strlen(case_->footer));
        if (!enc) perror("paseto_v2_local_encrypt failed");
        assert(enc != NULL);
        assert(strcmp(case_->encrypted, enc) == 0);
        free(enc);
        printf(" encryption ok...");

        size_t dec_len;
        uint8_t *footer;
        size_t footer_len;
        uint8_t *dec = paseto_v2_local_decrypt(
                case_->encrypted, &dec_len,
                key,
                &footer, &footer_len);
        if (!dec) perror("paseto_v2_local_decrypt failed");
        assert(dec != NULL);
        assert(dec_len == strlen(case_->message));
        assert(memcmp(case_->message, dec, dec_len) == 0);
        paseto_free(dec);
        if (strlen(case_->footer) == 0) {
            assert(footer == NULL);
            assert(footer_len == 0);
        } else {
            assert(footer != NULL);
            assert(footer_len == strlen(case_->footer));
            assert(strcmp(case_->footer, (const char *) footer) == 0);
            paseto_free(footer);
        }
        printf(" decryption ok\n");
    }
}